

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O3

ncnn_allocator_t ncnn_allocator_create_unlocked_pool_allocator(void)

{
  ncnn_allocator_t p_Var1;
  UnlockedPoolAllocator *this;
  
  p_Var1 = (ncnn_allocator_t)malloc(0x18);
  this = (UnlockedPoolAllocator *)operator_new(0x18);
  ncnn::UnlockedPoolAllocator::UnlockedPoolAllocator(this);
  (this->super_Allocator)._vptr_Allocator = (_func_int **)&PTR__UnlockedPoolAllocator_00611088;
  this[1].super_Allocator._vptr_Allocator = (_func_int **)p_Var1;
  p_Var1->pthis = this;
  p_Var1->fast_malloc = __ncnn_UnlockedPoolAllocator_fast_malloc;
  p_Var1->fast_free = __ncnn_UnlockedPoolAllocator_fast_free;
  return p_Var1;
}

Assistant:

ncnn_allocator_t ncnn_allocator_create_unlocked_pool_allocator()
{
    ncnn_allocator_t allocator = (ncnn_allocator_t)malloc(sizeof(struct __ncnn_allocator_t));
    allocator->pthis = (void*)(new UnlockedPoolAllocator_c_api(allocator));
    allocator->fast_malloc = __ncnn_UnlockedPoolAllocator_fast_malloc;
    allocator->fast_free = __ncnn_UnlockedPoolAllocator_fast_free;
    return allocator;
}